

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_list(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  char **siblings_00;
  uint16_t *flags;
  ly_stmt stmt_00;
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  lysp_node *plVar4;
  char *pcVar5;
  char *format;
  uint32_t substmt_index;
  lysp_node *plVar6;
  ly_ctx *plVar7;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x90);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_list");
    }
    else {
      plVar6 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar4 = plVar6;
          plVar6 = plVar4->next;
        } while (plVar6 != (lysp_node *)0x0);
        siblings = &plVar4->next;
      }
      *siblings = parent_00;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar7,stmt->arg,0,&parent_00->name);
      if (LVar3 == LY_SUCCESS) {
        parent_00->nodetype = 0x10;
        parent_00->parent = parent;
        stmt_01 = stmt->child;
        LVar3 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &parent_00->exts;
          siblings_00 = &parent_00[1].ref;
          flags = &parent_00->flags;
          iVar2 = (int)parent_00;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x80000) {
              if ((int)stmt_00 < 0x800) {
                if ((int)stmt_00 < 0x40) {
                  if (stmt_00 == LY_STMT_NOTIFICATION) {
                    plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (1 < *(byte *)&plVar1[2].schema) {
                      LVar3 = lysp_stmt_notif(ctx,stmt_01,parent_00,
                                              (lysp_node_notif **)&parent_00[1].exts);
                      goto LAB_0016a9c1;
                    }
                    plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
                    pcVar5 = "notification";
                  }
                  else if (stmt_00 == LY_STMT_ACTION) {
                    plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (1 < *(byte *)&plVar1[2].schema) {
                      LVar3 = lysp_stmt_action(ctx,stmt_01,parent_00,
                                               (lysp_node_action **)&parent_00[1].iffeatures);
                      goto LAB_0016a9c1;
                    }
                    plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
                    pcVar5 = "action";
                  }
                  else {
                    if (stmt_00 != LY_STMT_ANYDATA) goto LAB_0016aa05;
                    plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (1 < *(byte *)&plVar1[2].schema) goto LAB_0016a82b;
                    plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
                    pcVar5 = "anydata";
                  }
                  format = 
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ;
LAB_0016aa95:
                  ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"list");
                  return LY_EVALID;
                }
                if (stmt_00 == LY_STMT_ANYXML) {
LAB_0016a82b:
                  LVar3 = lysp_stmt_any(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
                else if (stmt_00 == LY_STMT_CHOICE) {
                  LVar3 = lysp_stmt_choice(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
                else {
                  if (stmt_00 != LY_STMT_CONTAINER) goto LAB_0016aa05;
                  LVar3 = lysp_stmt_container(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
              }
              else if ((int)stmt_00 < 0x4000) {
                if (stmt_00 == LY_STMT_GROUPING) {
                  LVar3 = lysp_stmt_grouping(ctx,stmt_01,parent_00,
                                             (lysp_node_grp **)&parent_00[1].dsc);
                }
                else if (stmt_00 == LY_STMT_LEAF) {
                  LVar3 = lysp_stmt_leaf(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
                else {
                  if (stmt_00 != LY_STMT_LEAF_LIST) goto LAB_0016aa05;
                  LVar3 = lysp_stmt_leaflist(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
              }
              else if (stmt_00 == LY_STMT_LIST) {
                LVar3 = lysp_stmt_list(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_USES) {
                LVar3 = lysp_stmt_uses(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else {
                if (stmt_00 != LY_STMT_CONFIG) goto LAB_0016aa05;
                LVar3 = lysp_stmt_config(ctx,stmt_01,flags,exts);
              }
            }
            else if ((int)stmt_00 < 0x1d0000) {
              if ((int)stmt_00 < 0x160000) {
                substmt_index = iVar2 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_0016a963:
                  in_R8 = exts;
                  LVar3 = lysp_stmt_text_field
                                    (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
                }
                else {
                  if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
                    plVar6 = (lysp_node *)&parent_00->iffeatures;
                    if (stmt_00 == LY_STMT_IF_FEATURE) goto LAB_0016a9b9;
                    goto LAB_0016aa05;
                  }
                  in_R8 = exts;
                  LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LIST,0,exts);
                }
              }
              else {
                substmt_index = iVar2 + 0x50;
                if (stmt_00 == LY_STMT_KEY) goto LAB_0016a963;
                if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
                  in_R8 = exts;
                  LVar3 = lysp_stmt_maxelements
                                    (ctx,stmt_01,(uint32_t *)&parent_00[2].field_0xc,flags,exts);
                }
                else {
                  if (stmt_00 != LY_STMT_MIN_ELEMENTS) goto LAB_0016aa05;
                  in_R8 = exts;
                  LVar3 = lysp_stmt_minelements
                                    (ctx,stmt_01,(uint32_t *)&parent_00[2].nodetype,flags,exts);
                }
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 == LY_STMT_MUST) {
                LVar3 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(parent_00 + 1));
              }
              else {
                if (stmt_00 != LY_STMT_ORDERED_BY) {
                  substmt_index = iVar2 + 0x28;
                  if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016a963;
                  goto LAB_0016aa05;
                }
                LVar3 = lysp_stmt_orderedby(ctx,stmt_01,flags,exts);
              }
            }
            else if ((int)stmt_00 < 0x300000) {
              if (stmt_00 == LY_STMT_STATUS) {
                LVar3 = lysp_stmt_status(ctx,stmt_01,flags,exts);
              }
              else {
                if (stmt_00 != LY_STMT_TYPEDEF) {
LAB_0016aa05:
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar7 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar7 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar5 = lyplg_ext_stmt2str(stmt_00);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
                  goto LAB_0016aa95;
                }
                LVar3 = lysp_stmt_typedef(ctx,stmt_01,parent_00,(lysp_tpdf **)&parent_00[1].name);
              }
            }
            else {
              plVar6 = parent_00 + 2;
              if (stmt_00 == LY_STMT_UNIQUE) {
LAB_0016a9b9:
                LVar3 = lysp_stmt_qnames(ctx,stmt_01,(lysp_qname **)plVar6,(yang_arg)exts,in_R8);
              }
              else {
                if (stmt_00 != LY_STMT_WHEN) goto LAB_0016aa05;
                LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&parent_00[1].nodetype);
              }
            }
LAB_0016a9c1:
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            stmt_01 = stmt_01->next;
            LVar3 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_list(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_list *list;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, list, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &list->name));
    list->nodetype = LYS_LIST;
    list->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->dsc, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &list->iffeatures, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->ref, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &list->when));
            break;
        case LY_STMT_KEY:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->key, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &list->max, &list->flags, &list->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &list->min, &list->flags, &list->exts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(lysp_stmt_orderedby(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_UNIQUE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &list->uniques, Y_STR_ARG, &list->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "list");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &list->node, &list->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &list->node, &list->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &list->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "list");
            LY_CHECK_RET(lysp_stmt_action(ctx, child, &list->node, &list->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &list->node, &list->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "list");
            LY_CHECK_RET(lysp_stmt_notif(ctx, child, &list->node, &list->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LIST, 0, &list->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "list");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}